

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O3

MPP_RET mpp_task_meta_get_packet(MppTask task,MppMetaKey key,MppPacket *packet)

{
  MPP_RET MVar1;
  MPP_RET MVar2;
  
  MVar1 = check_mpp_task_name(task);
  MVar2 = MPP_NOK;
  if (MVar1 == MPP_OK) {
    MVar2 = mpp_meta_get_packet(*(MppMeta *)((long)task + 0x28),key,packet);
    if (MVar2 == MPP_OK) {
      MVar2 = MPP_OK;
    }
    else {
      *packet = (MppPacket)0x0;
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_task_meta_get_packet(MppTask task, MppMetaKey key, MppPacket *packet)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_packet(impl->meta, key, packet);
    if (ret)
        *packet = NULL;
    return ret;
}